

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlElementPtr xmlValidGetElemDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,int *extsubset)

{
  xmlChar *key;
  xmlChar *key2;
  xmlHashTablePtr pxVar1;
  xmlElementPtr pxVar2;
  
  if ((elem == (xmlNodePtr)0x0 || (doc == (xmlDocPtr)0x0 || ctxt == (xmlValidCtxtPtr)0x0)) ||
     (key = elem->name, key == (xmlChar *)0x0)) {
    return (xmlElementPtr)0x0;
  }
  if (extsubset != (int *)0x0) {
    *extsubset = 0;
  }
  if ((elem->ns == (xmlNs *)0x0) || (key2 = elem->ns->prefix, key2 == (xmlChar *)0x0)) {
LAB_001587d4:
    if (((doc->intSubset != (_xmlDtd *)0x0) &&
        (pxVar1 = (xmlHashTablePtr)doc->intSubset->elements, pxVar1 != (xmlHashTablePtr)0x0)) &&
       (pxVar2 = (xmlElementPtr)xmlHashLookup2(pxVar1,elem->name,(xmlChar *)0x0),
       pxVar2 != (xmlElementPtr)0x0)) {
      return pxVar2;
    }
    if ((doc->extSubset != (_xmlDtd *)0x0) &&
       (pxVar1 = (xmlHashTablePtr)doc->extSubset->elements, pxVar1 != (xmlHashTablePtr)0x0)) {
      pxVar2 = (xmlElementPtr)xmlHashLookup2(pxVar1,elem->name,(xmlChar *)0x0);
      if ((extsubset != (int *)0x0) && (pxVar2 != (xmlElementPtr)0x0)) goto LAB_0015883c;
      if (pxVar2 != (xmlElementPtr)0x0) {
        return pxVar2;
      }
    }
    pxVar2 = (xmlElementPtr)0x0;
    xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_ELEM,2,elem->name,(xmlChar *)0x0,(xmlChar *)0x0,0,
                  "No declaration for element %s\n",elem->name,0,0);
  }
  else {
    if ((doc->intSubset != (_xmlDtd *)0x0) &&
       ((pxVar1 = (xmlHashTablePtr)doc->intSubset->elements, pxVar1 != (xmlHashTablePtr)0x0 &&
        (pxVar2 = (xmlElementPtr)xmlHashLookup2(pxVar1,key,key2), pxVar2 != (xmlElementPtr)0x0)))) {
      return pxVar2;
    }
    if ((doc->extSubset == (_xmlDtd *)0x0) ||
       (pxVar1 = (xmlHashTablePtr)doc->extSubset->elements, pxVar1 == (xmlHashTablePtr)0x0))
    goto LAB_001587d4;
    pxVar2 = (xmlElementPtr)xmlHashLookup2(pxVar1,elem->name,key2);
    if ((extsubset == (int *)0x0) || (pxVar2 == (xmlElementPtr)0x0)) {
      if (pxVar2 != (xmlElementPtr)0x0) {
        return pxVar2;
      }
      goto LAB_001587d4;
    }
LAB_0015883c:
    *extsubset = 1;
  }
  return pxVar2;
}

Assistant:

static xmlElementPtr
xmlValidGetElemDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
	            xmlNodePtr elem, int *extsubset) {
    xmlElementPtr elemDecl = NULL;
    const xmlChar *prefix = NULL;

    if ((ctxt == NULL) || (doc == NULL) ||
        (elem == NULL) || (elem->name == NULL))
        return(NULL);
    if (extsubset != NULL)
	*extsubset = 0;

    /*
     * Fetch the declaration for the qualified name
     */
    if ((elem->ns != NULL) && (elem->ns->prefix != NULL))
	prefix = elem->ns->prefix;

    if (prefix != NULL) {
	elemDecl = xmlGetDtdQElementDesc(doc->intSubset,
		                         elem->name, prefix);
	if ((elemDecl == NULL) && (doc->extSubset != NULL)) {
	    elemDecl = xmlGetDtdQElementDesc(doc->extSubset,
		                             elem->name, prefix);
	    if ((elemDecl != NULL) && (extsubset != NULL))
		*extsubset = 1;
	}
    }

    /*
     * Fetch the declaration for the non qualified name
     * This is "non-strict" validation should be done on the
     * full QName but in that case being flexible makes sense.
     */
    if (elemDecl == NULL) {
	elemDecl = xmlGetDtdQElementDesc(doc->intSubset, elem->name, NULL);
	if ((elemDecl == NULL) && (doc->extSubset != NULL)) {
	    elemDecl = xmlGetDtdQElementDesc(doc->extSubset, elem->name, NULL);
	    if ((elemDecl != NULL) && (extsubset != NULL))
		*extsubset = 1;
	}
    }
    if (elemDecl == NULL) {
	xmlErrValidNode(ctxt, elem,
			XML_DTD_UNKNOWN_ELEM,
	       "No declaration for element %s\n",
	       elem->name, NULL, NULL);
    }
    return(elemDecl);
}